

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O0

ER __thiscall slang::ast::DisableStatement::evalImpl(DisableStatement *this,EvalContext *context)

{
  string_view arg;
  SourceRange range;
  SourceLocation SVar1;
  Symbol *symbol;
  SourceLocation in_RSI;
  long in_RDI;
  undefined1 uVar2;
  bool isHierarchical;
  ArbitrarySymbolExpression *ase;
  Diagnostic *this_00;
  undefined2 in_stack_ffffffffffffffd8;
  undefined4 uVar3;
  undefined1 in_stack_ffffffffffffffde;
  long lVar4;
  undefined4 local_4;
  
  lVar4 = in_RDI;
  SVar1 = (SourceLocation)
          Expression::as<slang::ast::ArbitrarySymbolExpression>(*(Expression **)(in_RDI + 0x20));
  uVar2 = *(long *)((long)SVar1 + 0x38) != 0;
  if ((bool)uVar2) {
    uVar3 = 0xf000c;
    this_00 = *(Diagnostic **)(in_RDI + 0x18);
    range.endLoc = in_RSI;
    range.startLoc = SVar1;
    EvalContext::addDiag
              ((EvalContext *)
               CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffde,
                                       CONCAT42(0xf000c,in_stack_ffffffffffffffd8))),
               SUB84((ulong)lVar4 >> 0x20,0),range);
    not_null<const_slang::ast::Symbol_*>::operator->
              ((not_null<const_slang::ast::Symbol_*> *)0x9eea2c);
    arg._M_len._2_4_ = uVar3;
    arg._M_len._0_2_ = in_stack_ffffffffffffffd8;
    arg._M_len._6_1_ = in_stack_ffffffffffffffde;
    arg._M_len._7_1_ = uVar2;
    arg._M_str = (char *)SVar1;
    Diagnostic::operator<<(this_00,arg);
    local_4 = Fail;
  }
  else {
    symbol = not_null::operator_cast_to_Symbol_((not_null<const_slang::ast::Symbol_*> *)0x9eea78);
    EvalContext::setDisableTarget((EvalContext *)in_RSI,symbol,*(SourceRange *)(in_RDI + 0x10));
    local_4 = Disable;
  }
  return local_4;
}

Assistant:

ER DisableStatement::evalImpl(EvalContext& context) const {
    // Hierarchical names are disallowed in constant expressions and constant functions
    auto& ase = target.as<ArbitrarySymbolExpression>();
    const bool isHierarchical = ase.hierRef.target != nullptr;
    if (isHierarchical) {
        context.addDiag(diag::ConstEvalHierarchicalName, sourceRange) << ase.symbol->name;
        return ER::Fail;
    }

    SLANG_ASSERT(!context.getDisableTarget());
    context.setDisableTarget(ase.symbol, sourceRange);
    return ER::Disable;
}